

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O2

string * __thiscall
cfd::js::api::json::TweakPubkeyData::GetPubkeyString_abi_cxx11_
          (string *__return_storage_ptr__,TweakPubkeyData *this,TweakPubkeyData *obj)

{
  core::ConvertToString<std::__cxx11::string>
            (__return_storage_ptr__,(core *)&this->pubkey_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)obj);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetPubkeyString(  // line separate
      const TweakPubkeyData& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.pubkey_);
  }